

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O0

void __thiscall Omega_h::Library::~Library(Library *this)

{
  History *pHVar1;
  I32 IVar2;
  element_type *this_00;
  shared_ptr<Omega_h::Comm> local_48;
  shared_ptr<Omega_h::Comm> local_38;
  Impl local_28;
  Impl local_20;
  Real local_18;
  double total_runtime;
  Library *this_local;
  
  total_runtime = (double)this;
  if (profile::global_singleton_history != (History *)0x0) {
    local_20.__d.__r = (duration)now();
    local_28.__d.__r = (duration)(profile::global_singleton_history->start_time).impl.__d.__r;
    local_18 = Omega_h::operator-((Now)local_20.__d.__r,(Now)local_28.__d.__r);
    this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->world_);
    IVar2 = Comm::rank(this_00);
    if (IVar2 == 0) {
      profile::print_top_down_and_bottom_up(profile::global_singleton_history,local_18);
    }
    profile::print_top_sorted(profile::global_singleton_history,local_18);
    pHVar1 = profile::global_singleton_history;
    if (profile::global_singleton_history != (History *)0x0) {
      profile::History::~History(profile::global_singleton_history);
      operator_delete(pHVar1,0x70);
    }
    profile::global_singleton_history = (History *)0x0;
  }
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_38);
  std::shared_ptr<Omega_h::Comm>::operator=(&this->world_,&local_38);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_38);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_48);
  std::shared_ptr<Omega_h::Comm>::operator=(&this->self_,&local_48);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_48);
  disable_pooling();
  if (max_memory_stacktrace != (void *)0x0) {
    operator_delete__(max_memory_stacktrace);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map(&this->timers);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&this->self_);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&this->world_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->argv_);
  return;
}

Assistant:

Library::~Library() {
  if (Omega_h::profile::global_singleton_history) {
    double total_runtime = now() - Omega_h::profile::global_singleton_history->start_time;
    if (world_->rank() == 0) {
      // FIXME - parallelize?
      Omega_h::profile::print_top_down_and_bottom_up(
          *Omega_h::profile::global_singleton_history, total_runtime);
    }
    Omega_h::profile::print_top_sorted(
          *Omega_h::profile::global_singleton_history, total_runtime);
    delete Omega_h::profile::global_singleton_history;
    Omega_h::profile::global_singleton_history = nullptr;
  }
  // need to destroy all Comm objects prior to MPI_Finalize()
  world_ = CommPtr();
  self_ = CommPtr();
  disable_pooling();
#ifdef OMEGA_H_USE_KOKKOS
  if (we_called_kokkos_init) {
    Kokkos::finalize();
    we_called_kokkos_init = false;
  }
#endif
#ifdef OMEGA_H_USE_MPI
  if (we_called_mpi_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Finalize());
    we_called_mpi_init = false;
  }
#endif
  delete[] Omega_h::max_memory_stacktrace;
}